

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

size_t __thiscall
CoreML::Specification::UnaryFunctionLayerParams::ByteSizeLong(UnaryFunctionLayerParams *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  undefined4 in_EDX;
  uint uVar6;
  
  uVar6 = this->type_;
  if (uVar6 == 0) {
    uVar3 = 0;
  }
  else if ((int)uVar6 < 0) {
    uVar3 = 0xb;
  }
  else {
    iVar1 = 0x1f;
    if ((uVar6 | 1) != 0) {
      for (; (uVar6 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar3 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
  }
  auVar2._4_4_ = -(uint)(this->epsilon_ != 0.0);
  auVar2._0_4_ = -(uint)(this->alpha_ != 0.0);
  auVar2._8_4_ = -(uint)(this->shift_ != 0.0);
  auVar2._12_4_ = -(uint)(this->scale_ != 0.0);
  uVar6 = movmskps(in_EDX,auVar2);
  uVar5 = uVar3 + 5;
  if ((uVar6 & 1) == 0) {
    uVar5 = uVar3;
  }
  uVar3 = uVar5 + 5;
  if ((uVar6 & 2) == 0) {
    uVar3 = uVar5;
  }
  uVar5 = uVar3 + 5;
  if ((uVar6 & 4) == 0) {
    uVar5 = uVar3;
  }
  sVar4 = uVar5 + 5;
  if ((uVar6 & 8) == 0) {
    sVar4 = uVar5;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

inline ::CoreML::Specification::UnaryFunctionLayerParams_Operation UnaryFunctionLayerParams::type() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.UnaryFunctionLayerParams.type)
  return static_cast< ::CoreML::Specification::UnaryFunctionLayerParams_Operation >(type_);
}